

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldStateTest_SwapClean_Test::TestBody
          (MapFieldStateTest_SwapClean_Test *this)

{
  State SVar1;
  pointer arena;
  MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
  *pMVar2;
  MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
  *other_00;
  undefined1 local_20 [8];
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  other;
  MapFieldStateTest_SwapClean_Test *this_local;
  
  other._8_8_ = this;
  arena = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
          get(&(this->super_MapFieldStateTest).arena_);
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::ArenaHolder((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                 *)local_20,arena);
  pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
           ::get((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                  *)local_20);
  MapFieldStateTest::AddOneStillClean(&this->super_MapFieldStateTest,pMVar2);
  pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
           ::operator->(&(this->super_MapFieldStateTest).map_field_);
  other_00 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
             ::get((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                    *)local_20);
  MapFieldBase::Swap((MapFieldBase *)pMVar2,(MapFieldBase *)other_00);
  pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
           ::get(&(this->super_MapFieldStateTest).map_field_);
  MapFieldStateTest::Expect(&this->super_MapFieldStateTest,pMVar2,CLEAN,1,1);
  SVar1 = (this->super_MapFieldStateTest).state_;
  if (SVar1 == CLEAN) {
    pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
             ::get((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                    *)local_20);
    MapFieldStateTest::Expect(&this->super_MapFieldStateTest,pMVar2,CLEAN,1,1);
  }
  else if (SVar1 == MAP_DIRTY) {
    pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
             ::get((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                    *)local_20);
    MapFieldStateTest::Expect(&this->super_MapFieldStateTest,pMVar2,MAP_DIRTY,1,0);
  }
  else if (SVar1 == REPEATED_DIRTY) {
    pMVar2 = ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
             ::get((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                    *)local_20);
    MapFieldStateTest::Expect(&this->super_MapFieldStateTest,pMVar2,REPEATED_DIRTY,0,1);
  }
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder((ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
                  *)local_20);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, SwapClean) {
  ArenaHolder<MapFieldType> other(arena_.get());
  AddOneStillClean(other.get());

  map_field_->Swap(other.get());

  Expect(map_field_.get(), CLEAN, 1, 1);

  switch (state_) {
    case CLEAN:
      Expect(other.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(other.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(other.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}